

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::Path::Path(Path *this,String *name)

{
  String *pSVar1;
  size_t sVar2;
  size_t extraout_RDX;
  Path *this_00;
  StringPtr part;
  
  heapArray<kj::String>(&this->parts,1);
  Array<char>::operator=(&((this->parts).ptr)->content,&name->content);
  pSVar1 = (this->parts).ptr;
  sVar2 = (pSVar1->content).size_;
  if (sVar2 == 0) {
    this_00 = (Path *)0x3fdd82;
  }
  else {
    this_00 = (Path *)(pSVar1->content).ptr;
  }
  part.content.ptr = (char *)(sVar2 + (sVar2 == 0));
  part.content.size_ = extraout_RDX;
  validatePart(this_00,part);
  return;
}

Assistant:

Path::Path(String&& name): parts(heapArray<String>(1)) {
  parts[0] = kj::mv(name);
  validatePart(parts[0]);
}